

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# with_presence.cc
# Opt level: O2

void google::protobuf::compiler::rust::WithPresenceAccessorsInMsgImpl
               (Context *ctx,FieldDescriptor *field,AccessorCase accessor_case)

{
  char cVar1;
  FieldDescriptor *field_00;
  long lVar2;
  char *in_R9;
  string_view sVar3;
  string_view lifetime;
  undefined4 uStack_6b8;
  AccessorCase accessor_case_local;
  undefined8 uStack_6b0;
  _Any_data local_6a8;
  code *local_698;
  code *pcStack_690;
  undefined1 *local_688;
  undefined8 local_680;
  undefined1 local_678 [8];
  undefined8 uStack_670;
  undefined1 *local_668;
  undefined8 local_660;
  undefined1 local_658 [8];
  undefined8 uStack_650;
  undefined1 *local_648;
  undefined8 local_640;
  undefined1 local_638 [8];
  undefined8 uStack_630;
  string field_name;
  string local_608;
  string local_5e8;
  string local_5c8;
  string local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  string local_568;
  string_view local_548;
  Sub local_538 [4];
  undefined1 *local_258;
  undefined8 local_250;
  undefined1 local_248 [8];
  undefined8 uStack_240;
  variant<std::__cxx11::string,std::function<bool()>> local_238 [32];
  char local_218;
  undefined1 *local_210;
  undefined8 local_208;
  undefined1 local_200 [16];
  undefined1 local_1f0;
  undefined1 local_1a8;
  undefined1 *local_1a0;
  undefined8 local_198;
  undefined1 local_190 [8];
  undefined8 uStack_188;
  variant<std::__cxx11::string,std::function<bool()>> local_180 [32];
  char local_160;
  undefined1 *local_158;
  undefined8 local_150;
  undefined1 local_148 [16];
  undefined1 local_138;
  undefined1 local_f0;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  variant<std::__cxx11::string,std::function<bool()>> local_c8 [32];
  char local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined1 local_80;
  undefined1 local_38;
  
  accessor_case_local = accessor_case;
  cVar1 = google::protobuf::FieldDescriptor::has_presence();
  if (cVar1 != '\0') {
    FieldNameWithCollisionAvoidance_abi_cxx11_(&field_name,(rust *)field,field_00);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_568,"field",(allocator<char> *)((long)&uStack_6b0 + 7));
    sVar3._M_len._4_4_ = accessor_case_local;
    sVar3._M_len._0_4_ = uStack_6b8;
    sVar3._M_str = uStack_6b0;
    RsSafeName_abi_cxx11_(sVar3);
    io::Printer::Sub::Sub<std::__cxx11::string>(local_538,&local_568,&local_588);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5a8,"raw_field_name",(allocator<char> *)((long)&uStack_6b0 + 6));
    io::Printer::Sub::Sub<std::__cxx11::string&>(local_538 + 1,&local_5a8,&field_name);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5c8,"view_type",(allocator<char> *)((long)&uStack_6b0 + 5));
    sVar3 = ViewLifetime(accessor_case_local);
    lifetime._M_str = in_R9;
    lifetime._M_len = (size_t)sVar3._M_str;
    RsViewType_abi_cxx11_
              (&local_5e8,(rust *)ctx,(Context *)field,(FieldDescriptor *)sVar3._M_len,lifetime);
    io::Printer::Sub::Sub<std::__cxx11::string>(local_538 + 2,&local_5c8,&local_5e8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_608,"view_self",(allocator<char> *)((long)&uStack_6b0 + 4));
    local_548 = ViewReceiver(accessor_case_local);
    io::Printer::Sub::Sub<std::basic_string_view<char,std::char_traits<char>>>
              (local_538 + 3,&local_608,&local_548);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_648,"hazzer",(allocator<char> *)((long)&uStack_6b0 + 3));
    local_258 = local_248;
    if (local_648 == local_638) {
      uStack_240 = uStack_630;
    }
    else {
      local_258 = local_648;
    }
    local_250 = local_640;
    local_640 = 0;
    local_638[0] = 0;
    local_698 = (code *)0x0;
    pcStack_690 = (code *)0x0;
    local_6a8._M_unused._M_object = (void *)0x0;
    local_6a8._8_8_ = 0;
    local_648 = local_638;
    local_6a8._M_unused._M_object = operator_new(0x18);
    *(Context **)local_6a8._M_unused._0_8_ = ctx;
    *(FieldDescriptor **)((long)local_6a8._M_unused._0_8_ + 8) = field;
    *(code *)((long)local_6a8._M_unused._0_8_ + 0x10) = (code)0x0;
    pcStack_690 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
    local_698 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                ::_M_manager;
    std::variant<std::__cxx11::string,std::function<bool()>>::
    variant<std::function<bool()>,void,void,std::function<bool()>,void>
              (local_238,(function<bool_()> *)&local_6a8);
    std::_Function_base::~_Function_base((_Function_base *)&local_6a8);
    local_210 = local_200;
    local_208 = 0;
    local_200[0] = 0;
    local_1f0 = 0;
    if (local_218 == '\x01') {
      std::__cxx11::string::assign((char *)&local_210);
    }
    local_1a8 = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_668,"clearer",(allocator<char> *)((long)&uStack_6b0 + 2));
    local_1a0 = local_190;
    if (local_668 == local_658) {
      uStack_188 = uStack_650;
    }
    else {
      local_1a0 = local_668;
    }
    local_198 = local_660;
    local_660 = 0;
    local_658[0] = 0;
    local_698 = (code *)0x0;
    pcStack_690 = (code *)0x0;
    local_6a8._M_unused._M_object = (void *)0x0;
    local_6a8._8_8_ = 0;
    local_668 = local_658;
    local_6a8._M_unused._M_object = operator_new(0x20);
    *(AccessorCase **)local_6a8._M_unused._0_8_ = &accessor_case_local;
    *(Context **)((long)local_6a8._M_unused._0_8_ + 8) = ctx;
    *(FieldDescriptor **)((long)local_6a8._M_unused._0_8_ + 0x10) = field;
    *(code *)((long)local_6a8._M_unused._0_8_ + 0x18) = (code)0x0;
    pcStack_690 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
    local_698 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                ::_M_manager;
    std::variant<std::__cxx11::string,std::function<bool()>>::
    variant<std::function<bool()>,void,void,std::function<bool()>,void>
              (local_180,(function<bool_()> *)&local_6a8);
    std::_Function_base::~_Function_base((_Function_base *)&local_6a8);
    local_158 = local_148;
    local_150 = 0;
    local_148[0] = 0;
    local_138 = 0;
    if (local_160 == '\x01') {
      std::__cxx11::string::assign((char *)&local_158);
    }
    local_f0 = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_688,"opt_getter",(allocator<char> *)((long)&uStack_6b0 + 1));
    local_e8 = local_d8;
    if (local_688 == local_678) {
      uStack_d0 = uStack_670;
    }
    else {
      local_e8 = local_688;
    }
    local_e0 = local_680;
    local_680 = 0;
    local_678[0] = 0;
    local_698 = (code *)0x0;
    pcStack_690 = (code *)0x0;
    local_6a8._M_unused._M_object = (void *)0x0;
    local_6a8._8_8_ = 0;
    local_688 = local_678;
    local_6a8._M_unused._M_object = operator_new(0x18);
    *(FieldDescriptor **)local_6a8._M_unused._0_8_ = field;
    *(Context **)((long)local_6a8._M_unused._0_8_ + 8) = ctx;
    *(code *)((long)local_6a8._M_unused._0_8_ + 0x10) = (code)0x0;
    pcStack_690 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
    local_698 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                ::_M_manager;
    std::variant<std::__cxx11::string,std::function<bool()>>::
    variant<std::function<bool()>,void,void,std::function<bool()>,void>
              (local_c8,(function<bool_()> *)&local_6a8);
    std::_Function_base::~_Function_base((_Function_base *)&local_6a8);
    local_a0 = local_90;
    local_98 = 0;
    local_90[0] = 0;
    local_80 = 0;
    if (local_a8 == '\x01') {
      std::__cxx11::string::assign((char *)&local_a0);
    }
    local_38 = 0;
    Context::Emit(ctx,local_538,7,0x31,"\n    $hazzer$\n    $clearer$\n    $opt_getter$\n    ");
    lVar2 = 0x450;
    do {
      io::Printer::Sub::~Sub((Sub *)((long)&local_538[0].key_._M_dataplus._M_p + lVar2));
      lVar2 = lVar2 + -0xb8;
    } while (lVar2 != -0xb8);
    std::__cxx11::string::~string((string *)&local_688);
    std::__cxx11::string::~string((string *)&local_668);
    std::__cxx11::string::~string((string *)&local_648);
    std::__cxx11::string::~string((string *)&local_608);
    std::__cxx11::string::~string((string *)&local_5e8);
    std::__cxx11::string::~string((string *)&local_5c8);
    std::__cxx11::string::~string((string *)&local_5a8);
    std::__cxx11::string::~string((string *)&local_588);
    std::__cxx11::string::~string((string *)&local_568);
    std::__cxx11::string::~string((string *)&field_name);
    return;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_538,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/compiler/rust/accessors/with_presence.cc"
             ,0x1b,0x14,"field.has_presence()");
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_538);
}

Assistant:

void WithPresenceAccessorsInMsgImpl(Context& ctx, const FieldDescriptor& field,
                                    AccessorCase accessor_case) {
  ABSL_CHECK(field.has_presence());

  std::string field_name = FieldNameWithCollisionAvoidance(field);

  ctx.Emit(
      {{"field", RsSafeName(field_name)},
       {"raw_field_name", field_name},  // Never r# prefixed
       {"view_type", RsViewType(ctx, field, ViewLifetime(accessor_case))},
       {"view_self", ViewReceiver(accessor_case)},
       {"hazzer",
        [&] {
          if (ctx.is_cpp()) {
            ctx.Emit({{"hazzer_thunk", ThunkName(ctx, field, "has")}},
                     R"rs(
                  pub fn has_$raw_field_name$($view_self$) -> bool {
                    unsafe {
                      $hazzer_thunk$(self.raw_msg())
                    }
                  }
                  )rs");
          } else {
            ctx.Emit({{"upb_mt_field_index", UpbMiniTableFieldIndex(field)}},
                     R"rs(
                  pub fn has_$raw_field_name$($view_self$) -> bool {
                    unsafe {
                      let f = $pbr$::upb_MiniTable_GetFieldByIndex(
                          <Self as $pbr$::AssociatedMiniTable>::mini_table(),
                          $upb_mt_field_index$);
                      $pbr$::upb_Message_HasBaseField(self.raw_msg(), f)
                    }
                  }
                  )rs");
          }
        }},
       {"clearer",
        [&] {
          if (accessor_case == AccessorCase::VIEW) return;
          if (ctx.is_cpp()) {
            ctx.Emit({{"clearer_thunk", ThunkName(ctx, field, "clear")}},
                     R"rs(
                    pub fn clear_$raw_field_name$(&mut self) {
                      unsafe { $clearer_thunk$(self.raw_msg()) }
                    })rs");
          } else {
            ctx.Emit({{"upb_mt_field_index", UpbMiniTableFieldIndex(field)}},
                     R"rs(
                    pub fn clear_$raw_field_name$(&mut self) {
                      unsafe {
                        let mt = <Self as $pbr$::AssociatedMiniTable>::mini_table();
                        let f = $pbr$::upb_MiniTable_GetFieldByIndex(
                            mt, $upb_mt_field_index$);
                        $pbr$::upb_Message_ClearBaseField(self.raw_msg(), f);
                      }
                    })rs");
          }
        }},
       {"opt_getter",
        [&] {
          // Cord fields don't support the _opt getter.
          if (field.options().ctype() == FieldOptions::CORD) return;
          ctx.Emit(
              R"rs(
              pub fn $raw_field_name$_opt($view_self$) -> $pb$::Optional<$view_type$> {
                    $pb$::Optional::new(self.$field$(), self.has_$raw_field_name$())
              }
              )rs");
        }}},
      R"rs(
    $hazzer$
    $clearer$
    $opt_getter$
    )rs");
}